

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

void __thiscall
RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
::RandomTestData(RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *this,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                       *in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  std::__cxx11::u32string::u32string((u32string *)this,in_delim);
  this->m_fixed_word_count = in_fixed_word_count;
  this->m_fixed_word_length = in_fixed_word_length;
  (this->m_str)._M_dataplus._M_p = (pointer)&(this->m_str).field_2;
  (this->m_str)._M_string_length = 0;
  (this->m_str).field_2._M_local_buf[0] = L'\0';
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  populate(this);
  return;
}

Assistant:

RandomTestData(StringT in_delim, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_delim{ in_delim },
		m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		populate();
	}